

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int ffghad(fitsfile *fptr,long *headstart,long *datastart,long *dataend,int *status)

{
  LONGLONG edata;
  LONGLONG sdata;
  LONGLONG shead;
  long local_38;
  long local_30;
  long local_28;
  
  if (0 < *status) {
    return *status;
  }
  ffghadll(fptr,&local_28,&local_30,&local_38,status);
  if (headstart != (long *)0x0) {
    *headstart = local_28;
  }
  if (datastart != (long *)0x0) {
    *datastart = local_30;
  }
  if (dataend != (long *)0x0) {
    *dataend = local_38;
  }
  return *status;
}

Assistant:

int ffghad(fitsfile *fptr,     /* I - FITS file pointer                     */
            long *headstart,  /* O - byte offset to beginning of CHDU      */
            long *datastart,  /* O - byte offset to beginning of next HDU  */
            long *dataend,    /* O - byte offset to beginning of next HDU  */
            int *status)       /* IO - error status     */
/*
  Return the address (= byte offset) in the FITS file to the beginning of
  the current HDU, the beginning of the data unit, and the end of the data unit.
*/
{
    LONGLONG shead, sdata, edata;

    if (*status > 0)
        return(*status);

    ffghadll(fptr, &shead, &sdata, &edata, status);

    if (headstart)
    {
        if (shead > LONG_MAX)
            *status = NUM_OVERFLOW;
        else
            *headstart = (long) shead;
    }

    if (datastart)
    {
        if (sdata > LONG_MAX)
            *status = NUM_OVERFLOW;
        else
            *datastart = (long) sdata;
    }

    if (dataend)
    {
        if (edata > LONG_MAX)
            *status = NUM_OVERFLOW;
        else
            *dataend = (long) edata;       
    }

    return(*status);
}